

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::release
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this)

{
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>
  *poVar1;
  size_type sVar2;
  size_type sVar3;
  unique_lock<std::mutex> l2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_38;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  local_38._M_device = &this->m_destruction_mutex;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  poVar1 = (this->m_deferred_destruction).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
           .member;
  sVar2 = (this->m_files).node_count;
  (this->m_deferred_destruction).
  super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
  .member = (this->m_files).
            super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
            .member;
  (this->m_files).
  super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
  .member = poVar1;
  sVar3 = (this->m_deferred_destruction).node_count;
  (this->m_deferred_destruction).node_count = sVar2;
  (this->m_files).node_count = sVar3;
  ::std::unique_lock<std::mutex>::unlock(&local_28);
  boost::multi_index::
  multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>
  ::clear_(&this->m_deferred_destruction);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::release()
	{
		std::unique_lock<std::mutex> l(m_mutex);
		std::unique_lock<std::mutex> l2(m_destruction_mutex);
		m_deferred_destruction = std::move(m_files);
		l.unlock();

		// the files and mappings will be destructed here, not holding the main
		// mutex
		m_deferred_destruction.clear();
	}